

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O0

void __thiscall test_app::test_buffer_size(test_app *this,bool async)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  void *pvVar5;
  byte in_SIL;
  char *pcVar6;
  allocator *in_stack_fffffffffffffa20;
  int file_line;
  test_app *in_stack_fffffffffffffa28;
  allocator *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa38;
  allocator *paVar7;
  allocator local_541;
  string local_540 [32];
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [32];
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [32];
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [32];
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  string local_400 [30];
  undefined1 in_stack_fffffffffffffc1e;
  undefined1 in_stack_fffffffffffffc1f;
  test_app *in_stack_fffffffffffffc20;
  string local_3d8 [32];
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  string local_328 [39];
  allocator local_301;
  string local_300 [32];
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator local_271;
  string local_270 [32];
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  poVar3 = std::operator<<((ostream *)&std::cout,"- Test setbuf/flush ");
  pcVar6 = "sync";
  if ((local_9 & 1) != 0) {
    pcVar6 = "async";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  set_context(in_stack_fffffffffffffc20,(bool)in_stack_fffffffffffffc1f,
              (bool)in_stack_fffffffffffffc1e);
  if ((local_9 & 1) == 0) {
    uVar4 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar4);
  }
  else {
    uVar4 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar4);
  }
  bVar1 = (bool)cppcms::application::response();
  cppcms::http::response::full_asynchronous_buffering(bVar1);
  cppcms::application::response();
  pvVar5 = (void *)cppcms::http::response::out();
  std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::__cxx11::string::~string(local_30);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"x");
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"[x]",&local_71);
  file_line = (int)((ulong)in_stack_fffffffffffffa20 >> 0x20);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_50);
  cppcms::application::response();
  pvVar5 = (void *)cppcms::http::response::out();
  std::ostream::operator<<(pvVar5,0x7b);
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  remove_brakets(in_stack_fffffffffffffa38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"[123]",&local_109);
  remove_brakets(in_stack_fffffffffffffa38);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"abcdefg");
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"[abcdefg]",&local_151);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_130);
  cppcms::application::response();
  pvVar5 = (void *)cppcms::http::response::out();
  std::ostream::operator<<(pvVar5,0x7c);
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"",&local_199);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string(local_178);
  cppcms::application::response();
  pvVar5 = (void *)cppcms::http::response::out();
  std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"[124]",&local_1e1);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1c0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'0');
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"",&local_229);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_208);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'1');
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"",&local_271);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_250);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'2');
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"",&local_2b9);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string(local_298);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'3');
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"",&local_301);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string(local_2e0);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,'4');
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"[01234]",&local_349);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_328);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"xxx");
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"[xxx]",&local_391);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,file_line)
  ;
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_370);
  if ((local_9 & 1) != 0) {
    iVar2 = cppcms::application::response();
    cppcms::http::response::setbuf(iVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"-- fully/partially buffered mode");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::operator<<(poVar3,"12345678");
    str_abi_cxx11_(in_stack_fffffffffffffa28);
    paVar7 = (allocator *)&stack0xfffffffffffffc27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d8,"",paVar7);
    compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,
                    file_line);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc27);
    std::__cxx11::string::~string(local_3b8);
    cppcms::application::response();
    pvVar5 = (void *)cppcms::http::response::out();
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
    str_abi_cxx11_(in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa30 = &local_421;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"",in_stack_fffffffffffffa30);
    compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,
                    file_line);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string(local_400);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    str_abi_cxx11_(in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa28 = (test_app *)&local_469;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_468,"[12345678]",(allocator *)in_stack_fffffffffffffa28);
    compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,
                    file_line);
    std::__cxx11::string::~string(local_468);
    std::allocator<char>::~allocator(&local_469);
    std::__cxx11::string::~string(local_448);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::operator<<(poVar3,"123");
    str_abi_cxx11_(in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa20 = &local_4b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b0,"",in_stack_fffffffffffffa20);
    iVar2 = (int)((ulong)in_stack_fffffffffffffa20 >> 0x20);
    compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,iVar2);
    std::__cxx11::string::~string(local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    std::__cxx11::string::~string(local_490);
    bVar1 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar1);
    cppcms::application::response();
    pvVar5 = (void *)cppcms::http::response::out();
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
    str_abi_cxx11_(in_stack_fffffffffffffa28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"[123]",&local_4f9);
    compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,iVar2);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::__cxx11::string::~string(local_4d8);
  }
  cppcms::application::response();
  cppcms::http::response::finalize();
  str_abi_cxx11_(in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"[EOF]",&local_541);
  compare_strings((string *)in_stack_fffffffffffffa30,(string *)in_stack_fffffffffffffa28,
                  (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string(local_520);
  return;
}

Assistant:

void test_buffer_size(bool async)
	{
		std::cout << "- Test setbuf/flush " << (async ? "async" : "sync")<< std::endl;
		set_context(true,true);
		if(async) {
			response().io_mode(cppcms::http::response::asynchronous);
		}
		else {
			response().io_mode(cppcms::http::response::nogzip);
		}
		response().full_asynchronous_buffering(false);
		response().out() << std::flush;
		response().setbuf(0);
		str();
		response().out() << "x";
		TEQ(str(),"[x]");
		response().out() << 123;
		TEQC(str(),"[123]");
		response().setbuf(4);
		response().out() << "abcdefg";
		TEQ(str(),"[abcdefg]");
		response().out() << 124;
		TEQ(str(),"");
		response().out() << std::flush;
		TEQ(str(),"[124]");
		response().out() << '0';
		TEQ(str(),"");
		response().out() << '1';
		TEQ(str(),"");
		response().out() << '2';
		TEQ(str(),"");
		response().out() << '3';
		TEQ(str(),"");
		response().out() << '4';
		TEQ(str(),"[01234]");
		response().out() << "xxx";
		response().setbuf(0);
		TEQ(str(),"[xxx]");
		if(async) {
			response().setbuf(4);
			std::cout<< "-- fully/partially buffered mode" << std::endl;
			response().full_asynchronous_buffering(true);
			response().out() << "12345678";
			TEQ(str(),"");
			response().out() << std::flush;
			TEQ(str(),"");
			response().full_asynchronous_buffering(false);
			TEQ(str(),"[12345678]");
			response().full_asynchronous_buffering(true);
			response().out() << "123";
			TEQ(str(),"");
			response().full_asynchronous_buffering(false);
			response().out() << std::flush;
			TEQ(str(),"[123]");
		}
		response().finalize();
		TEQ(str(),"[EOF]");
	}